

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastPrintMatrix(Gia_Man_t *p,Vec_Wec_t *vProds,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int v;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *vVec;
  Vec_Wrd_t *vTemp;
  word *__s;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  ulong uVar8;
  int Counter;
  uint uVar9;
  int iVar10;
  int i;
  int iVar11;
  word Truth;
  
  vVec = Vec_IntAlloc(100);
  iVar10 = p->nObjs;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar11 = iVar10;
  }
  vTemp->nCap = iVar11;
  if (iVar11 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar11 << 3);
  }
  vTemp->pArray = __s;
  vTemp->nSize = iVar10;
  memset(__s,0,(long)iVar10 << 3);
  iVar10 = 0;
  do {
    iVar11 = vProds->nSize;
    if (iVar11 <= iVar10) {
      uVar9 = 0;
      for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
        pVVar5 = Vec_WecEntry(vProds,iVar10);
        uVar9 = uVar9 + pVVar5->nSize;
        iVar11 = vProds->nSize;
      }
      uVar4 = vVec->nSize;
      uVar3 = Gia_ManAndNum(p);
      printf("Booth partial products: %d pps, %d unique, %d nodes.\n",(ulong)uVar9,(ulong)uVar4,
             (ulong)uVar3);
      Vec_IntPrint(vVec);
      if (fVerbose != 0) {
        for (uVar9 = 0; (int)uVar9 < vProds->nSize; uVar9 = uVar9 + 1) {
          pVVar5 = Vec_WecEntry(vProds,uVar9);
          for (iVar10 = 0; iVar10 < pVVar5->nSize; iVar10 = iVar10 + 1) {
            iVar11 = Vec_IntEntry(pVVar5,iVar10);
            uVar4 = Abc_Lit2Var(iVar11);
            printf("Obj = %4d : ",(ulong)uVar4);
            uVar4 = Abc_LitIsCompl(iVar11);
            printf("Compl = %d  ",(ulong)uVar4);
            printf("Rank = %2d  ",(ulong)uVar9);
            Truth = Gia_ObjComputeTruth6Cis(p,iVar11,vVec,vTemp);
            Extra_PrintHex(_stdout,(uint *)&Truth,vVec->nSize);
            iVar11 = vVec->nSize;
            if (iVar11 == 4) {
              printf("    ");
              iVar11 = vVec->nSize;
            }
            if (iVar11 == 3) {
              printf("      ");
              iVar11 = vVec->nSize;
            }
            if (iVar11 < 3) {
              printf("       ");
            }
            printf("  ");
            Vec_IntPrint(vVec);
            if (iVar10 == pVVar5->nSize + -1) {
              putchar(10);
            }
          }
        }
      }
      Vec_IntFree(vVec);
      free(vTemp->pArray);
      free(vTemp);
      return;
    }
    pVVar5 = Vec_WecEntry(vProds,iVar10);
    for (iVar11 = 0; iVar11 < pVVar5->nSize; iVar11 = iVar11 + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iVar11);
      v = Abc_Lit2Var(iVar2);
      pGVar6 = Gia_ManObj(p,v);
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar2 = Abc_Lit2Var(iVar2);
        uVar7 = (ulong)(uint)vVec->nSize;
        if (vVec->nSize < 1) {
          uVar7 = 0;
        }
        uVar8 = 0;
        do {
          if (uVar7 == uVar8) {
            Vec_IntPush(vVec,iVar2);
            break;
          }
          piVar1 = vVec->pArray + uVar8;
          uVar8 = uVar8 + 1;
        } while (*piVar1 != iVar2);
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void Wlc_BlastPrintMatrix( Gia_Man_t * p, Vec_Wec_t * vProds, int fVerbose )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;  word Truth;
    int i, k, iLit; 
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                Vec_IntPushUnique( vSupp, Abc_Lit2Var(iLit) );
    printf( "Booth partial products: %d pps, %d unique, %d nodes.\n", 
        Vec_WecSizeSize(vProds), Vec_IntSize(vSupp), Gia_ManAndNum(p) );
    Vec_IntPrint( vSupp );

    if ( fVerbose )
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            printf( "Obj = %4d : ", Abc_Lit2Var(iLit) );
            printf( "Compl = %d  ", Abc_LitIsCompl(iLit) );
            printf( "Rank = %2d  ", i );
            Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
            if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
            if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
            if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
            printf( "  " );
            Vec_IntPrint( vSupp );
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
}